

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpReader.cpp
# Opt level: O1

void __thiscall OpenMD::DumpReader::~DumpReader(DumpReader *this)

{
  pointer pfVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  pfVar1 = (this->framePos_).
           super__Vector_base<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1,(long)(this->framePos_).
                                 super__Vector_base<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pfVar1);
  }
  std::ifstream::~ifstream(&this->inFile_);
  pcVar2 = (this->filename_)._M_dataplus._M_p;
  paVar3 = &(this->filename_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

DumpReader::~DumpReader() {
#ifdef IS_MPI
    strcpy(checkPointMsg, "Dump file closed successfully.");
    errorCheckPoint();
#endif
  }